

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svector_test.cc
# Opt level: O0

void __thiscall
fizplex::SVectorTest_EmptyHasZeolength_Test::TestBody(SVectorTest_EmptyHasZeolength_Test *this)

{
  bool bVar1;
  size_t sVar2;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar_;
  bool *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  string local_78;
  AssertHelper local_58;
  Message local_50 [6];
  undefined1 local_19;
  AssertionResult local_18;
  
  SVector::SVector((SVector *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  sVar2 = SVector::length((SVector *)0x1b0658);
  local_19 = sVar2 == 0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68,(type *)0x1b0682);
  SVector::~SVector((SVector *)0x1b068e);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message(local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(internal *)&local_18,(AssertionResult *)"SVector().length() == 0","false",
               "true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/svector_test.cc"
               ,6,message);
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    testing::Message::~Message((Message *)0x1b076e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1b07cb);
  return;
}

Assistant:

TEST(SVectorTest, EmptyHasZeolength) { EXPECT_TRUE(SVector().length() == 0); }